

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c.c
# Opt level: O0

int md_is_named_entity_contents
              (MD_CTX *ctx,MD_CHAR *text,MD_OFFSET beg,MD_OFFSET max_end,MD_OFFSET *p_end)

{
  bool bVar1;
  MD_OFFSET off;
  MD_OFFSET *p_end_local;
  MD_OFFSET max_end_local;
  MD_OFFSET beg_local;
  MD_CHAR *text_local;
  MD_CTX *ctx_local;
  int local_4;
  
  if ((beg < max_end) &&
     (((0x40 < (byte)text[beg] && ((byte)text[beg] < 0x5b)) ||
      ((0x60 < (byte)text[beg] && ((byte)text[beg] < 0x7b)))))) {
    off = beg + 1;
    while( true ) {
      bVar1 = false;
      if ((off < max_end) &&
         (((0x40 < (byte)text[off] && ((byte)text[off] < 0x5b)) ||
          (((0x60 < (byte)text[off] && ((byte)text[off] < 0x7b)) ||
           ((bVar1 = false, 0x2f < (byte)text[off] && (bVar1 = false, (byte)text[off] < 0x3a))))))))
      {
        bVar1 = off - beg < 0x31;
      }
      if (!bVar1) break;
      off = off + 1;
    }
    if ((off - beg < 2) || (0x30 < off - beg)) {
      local_4 = 0;
    }
    else {
      *p_end = off;
      local_4 = 1;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int
md_is_named_entity_contents(MD_CTX* ctx, const CHAR* text, OFF beg, OFF max_end, OFF* p_end)
{
    OFF off = beg;
    MD_UNUSED(ctx);

    if(off < max_end  &&  ISALPHA_(text[off]))
        off++;
    else
        return FALSE;

    while(off < max_end  &&  ISALNUM_(text[off])  &&  off - beg <= 48)
        off++;

    if(2 <= off - beg  &&  off - beg <= 48) {
        *p_end = off;
        return TRUE;
    } else {
        return FALSE;
    }
}